

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O0

void __thiscall
QOpenGLProgramBinarySupportCheck::QOpenGLProgramBinarySupportCheck
          (QOpenGLProgramBinarySupportCheck *this,QOpenGLContext *context)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  QLoggingCategory *cat;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  bool hasExt_1;
  bool hasExt;
  QOpenGLContext *ctx;
  GLint fmtCount;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_6;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_5;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_4;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  uint in_stack_fffffffffffffe24;
  QLoggingCategory *in_stack_fffffffffffffe28;
  uint in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  char local_1a0 [32];
  char local_180 [36];
  uint local_15c;
  char local_158 [32];
  QByteArray local_138;
  char local_120 [32];
  QByteArray local_100;
  QSurfaceFormat local_e8;
  QSurfaceFormat local_e0;
  char local_d8 [32];
  char local_b8 [32];
  char local_98 [32];
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QOpenGLContext::shareGroup
            ((QOpenGLContext *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  QOpenGLSharedResource::QOpenGLSharedResource
            ((QOpenGLSharedResource *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             (QOpenGLContextGroup *)in_stack_fffffffffffffe28);
  *in_RDI = &PTR__QOpenGLProgramBinarySupportCheck_00e20e58;
  *(undefined1 *)(in_RDI + 2) = 0;
  uVar5 = QCoreApplication::testAttribute(AA_DisableShaderDiskCache);
  if ((uVar5 & 1) == 0) {
    iVar3 = qEnvironmentVariableIntValue("QT_DISABLE_SHADER_DISK_CACHE",(bool *)0x0);
    if (iVar3 == 0) {
      cat = (QLoggingCategory *)QOpenGLContext::currentContext();
      if (cat != (QLoggingCategory *)0x0) {
        bVar2 = QOpenGLContext::isOpenGLES
                          ((QOpenGLContext *)
                           CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        if (bVar2) {
          local_38 = &DAT_aaaaaaaaaaaaaaaa;
          local_30 = &DAT_aaaaaaaaaaaaaaaa;
          QtPrivateLogging::lcOpenGLProgramDiskCache();
          anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::
          QLoggingCategoryMacroHolder
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                     in_stack_fffffffffffffe18);
          while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_38), bVar2) {
            anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x912218);
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       (char *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                       (char *)in_stack_fffffffffffffe18,(char *)0x912231);
            QOpenGLContext::format((QOpenGLContext *)in_stack_fffffffffffffe28);
            uVar4 = QSurfaceFormat::majorVersion(&local_e0);
            QMessageLogger::debug(local_d8,"OpenGL ES v%d context",(ulong)uVar4);
            QSurfaceFormat::~QSurfaceFormat
                      ((QSurfaceFormat *)
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
            local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
          }
          QOpenGLContext::format((QOpenGLContext *)in_stack_fffffffffffffe28);
          in_stack_fffffffffffffe34 = QSurfaceFormat::majorVersion(&local_e8);
          QSurfaceFormat::~QSurfaceFormat
                    ((QSurfaceFormat *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
                    );
          if (in_stack_fffffffffffffe34 < 3) {
            QByteArray::QByteArray(&local_100,"GL_OES_get_program_binary",-1);
            bVar2 = QOpenGLContext::hasExtension
                              ((QOpenGLContext *)
                               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                               (QByteArray *)cat);
            in_stack_fffffffffffffe30 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe30);
            QByteArray::~QByteArray((QByteArray *)0x912311);
            uVar1 = in_stack_fffffffffffffe30 >> 0x18;
            uVar4 = in_stack_fffffffffffffe30 & 0x1000000;
            local_48 = &DAT_aaaaaaaaaaaaaaaa;
            local_40 = &DAT_aaaaaaaaaaaaaaaa;
            QtPrivateLogging::lcOpenGLProgramDiskCache();
            anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::
            QLoggingCategoryMacroHolder
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                       CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       in_stack_fffffffffffffe18);
            while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                     ((QLoggingCategoryMacroHolder *)&local_48), bVar2) {
              anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                        ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x91236e);
              QMessageLogger::QMessageLogger
                        ((QMessageLogger *)
                         CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),(char *)cat,
                         in_stack_fffffffffffffe24,(char *)in_stack_fffffffffffffe18,
                         (char *)0x912387);
              QMessageLogger::debug
                        (local_120,"GL_OES_get_program_binary support = %d",(ulong)((byte)uVar1 & 1)
                        );
              local_40 = (undefined1 *)((ulong)local_40 & 0xffffffffffffff00);
            }
            if (uVar4 != 0) {
              *(undefined1 *)(in_RDI + 2) = 1;
            }
          }
          else {
            *(undefined1 *)(in_RDI + 2) = 1;
            cat = in_stack_fffffffffffffe28;
          }
        }
        else {
          QByteArray::QByteArray(&local_138,"GL_ARB_get_program_binary",-1);
          bVar2 = QOpenGLContext::hasExtension
                            ((QOpenGLContext *)
                             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                             (QByteArray *)in_stack_fffffffffffffe28);
          in_stack_fffffffffffffe24 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe24);
          QByteArray::~QByteArray((QByteArray *)0x91240d);
          uVar1 = in_stack_fffffffffffffe24 >> 0x18;
          uVar4 = in_stack_fffffffffffffe24 & 0x1000000;
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          local_50 = &DAT_aaaaaaaaaaaaaaaa;
          QtPrivateLogging::lcOpenGLProgramDiskCache();
          anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::
          QLoggingCategoryMacroHolder
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),cat);
          in_stack_fffffffffffffe18 = cat;
          cat = in_stack_fffffffffffffe28;
          while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_58), bVar2) {
            anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x91246a);
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),(char *)cat,
                       in_stack_fffffffffffffe24,(char *)in_stack_fffffffffffffe18,(char *)0x912483)
            ;
            QMessageLogger::debug
                      (local_158,"GL_ARB_get_program_binary support = %d",(ulong)((byte)uVar1 & 1));
            local_50 = (undefined1 *)((ulong)local_50 & 0xffffffffffffff00);
          }
          if (uVar4 != 0) {
            *(undefined1 *)(in_RDI + 2) = 1;
          }
        }
        in_stack_fffffffffffffe28 = cat;
        if ((*(byte *)(in_RDI + 2) & 1) != 0) {
          local_15c = 0;
          QOpenGLContext::functions
                    ((QOpenGLContext *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
                    );
          QOpenGLFunctions::glGetIntegerv
                    ((QOpenGLFunctions *)
                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                     (GLenum)((ulong)in_stack_fffffffffffffe18 >> 0x20),(GLint *)0x9124f7);
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          local_60 = &DAT_aaaaaaaaaaaaaaaa;
          QtPrivateLogging::lcOpenGLProgramDiskCache();
          anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::
          QLoggingCategoryMacroHolder
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                     CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                     in_stack_fffffffffffffe18);
          while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_68), bVar2) {
            anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x91254a);
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),(char *)cat,
                       in_stack_fffffffffffffe24,(char *)in_stack_fffffffffffffe18,(char *)0x912560)
            ;
            QMessageLogger::debug(local_180,"Supported binary format count = %d",(ulong)local_15c);
            local_60 = (undefined1 *)((ulong)local_60 & 0xffffffffffffff00);
          }
          *(bool *)(in_RDI + 2) = 0 < (int)local_15c;
          in_stack_fffffffffffffe28 = cat;
        }
      }
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcOpenGLProgramDiskCache();
      anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 in_stack_fffffffffffffe18);
      while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_78), bVar2) {
        anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x9125ef);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   (char *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                   (char *)in_stack_fffffffffffffe18,(char *)0x912605);
        QMessageLogger::debug
                  (local_1a0,"Shader cache supported = %d",(ulong)(*(byte *)(in_RDI + 2) & 1));
        local_70 = (undefined1 *)((ulong)local_70 & 0xffffffffffffff00);
      }
    }
    else {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcOpenGLProgramDiskCache();
      anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 in_stack_fffffffffffffe18);
      while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_28), bVar2) {
        anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x91215e);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                   (char *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                   (char *)in_stack_fffffffffffffe18,(char *)0x912177);
        QMessageLogger::debug(local_b8,"Shader cache disabled via env var");
        local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
      }
    }
  }
  else {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcOpenGLProgramDiskCache();
    anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe18);
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar2) {
      anon_unknown.dwarf_175eb32::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x9120b4);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 (char *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                 (char *)in_stack_fffffffffffffe18,(char *)0x9120cd);
      QMessageLogger::debug(local_98,"Shader cache disabled via app attribute");
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QOpenGLProgramBinarySupportCheck::QOpenGLProgramBinarySupportCheck(QOpenGLContext *context)
    : QOpenGLSharedResource(context->shareGroup()),
      m_supported(false)
{
    if (QCoreApplication::testAttribute(Qt::AA_DisableShaderDiskCache)) {
        qCDebug(lcOpenGLProgramDiskCache, "Shader cache disabled via app attribute");
        return;
    }
    if (qEnvironmentVariableIntValue("QT_DISABLE_SHADER_DISK_CACHE")) {
        qCDebug(lcOpenGLProgramDiskCache, "Shader cache disabled via env var");
        return;
    }

    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    if (ctx) {
        if (ctx->isOpenGLES()) {
            qCDebug(lcOpenGLProgramDiskCache, "OpenGL ES v%d context", ctx->format().majorVersion());
            if (ctx->format().majorVersion() >= 3) {
                m_supported = true;
            } else {
                const bool hasExt = ctx->hasExtension("GL_OES_get_program_binary");
                qCDebug(lcOpenGLProgramDiskCache, "GL_OES_get_program_binary support = %d", hasExt);
                if (hasExt)
                    m_supported = true;
            }
        } else {
            const bool hasExt = ctx->hasExtension("GL_ARB_get_program_binary");
            qCDebug(lcOpenGLProgramDiskCache, "GL_ARB_get_program_binary support = %d", hasExt);
            if (hasExt)
                m_supported = true;
        }
        if (m_supported) {
            GLint fmtCount = 0;
            ctx->functions()->glGetIntegerv(GL_NUM_PROGRAM_BINARY_FORMATS, &fmtCount);
            qCDebug(lcOpenGLProgramDiskCache, "Supported binary format count = %d", fmtCount);
            m_supported = fmtCount > 0;
        }
    }
    qCDebug(lcOpenGLProgramDiskCache, "Shader cache supported = %d", m_supported);
}